

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O3

Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
floatFromString(Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  char *endptr;
  char *local_58;
  string local_50;
  char local_20 [8];
  undefined8 uStack_18;
  
  local_58 = (char *)0x0;
  fVar2 = strtof((s->_M_dataplus)._M_p,&local_58);
  if ((s->_M_string_length == 0) || (*local_58 != '\0')) {
    format_abi_cxx11_(&local_50,"Cannot convert \'%s\' to float",(s->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      uStack_18 = local_50.field_2._8_8_;
      local_50._M_dataplus._M_p = local_20;
    }
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if (local_50._M_dataplus._M_p == local_20) {
      paVar1->_M_allocated_capacity = local_50.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           uStack_18;
    }
    else {
      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = local_50._M_dataplus._M_p;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           local_50.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_50._M_string_length;
    __return_storage_ptr__->has_value_ = false;
  }
  else {
    (__return_storage_ptr__->field_0).value_ = fVar2;
    __return_storage_ptr__->has_value_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<float, std::string> floatFromString(const std::string &s) {
		char *endptr = nullptr;
		const float ret = strtof(s.c_str(), &endptr);
		if (s.empty() || endptr[0] != '\0')
			return Unexpected(format("Cannot convert '%s' to float", s.c_str()));
		return ret;
}